

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promp.cpp
# Opt level: O0

void __thiscall ProMP::ProMP(ProMP *this,MatrixXd *data,int numBf,double stdBf)

{
  Index IVar1;
  MatrixXd local_60;
  undefined1 local_48 [40];
  double stdBf_local;
  MatrixXd *pMStack_18;
  int numBf_local;
  MatrixXd *data_local;
  ProMP *this_local;
  
  this->numBf_ = numBf;
  this->stdBf_ = stdBf;
  local_48._32_8_ = stdBf;
  stdBf_local._4_4_ = numBf;
  pMStack_18 = data;
  data_local = (MatrixXd *)this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->means);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&this->viaPoints_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->phase_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->demoTrajs_,pMStack_18);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->numBfMid_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->phi_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->w_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->phaseDiff_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->meanW_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->stdW_);
  IVar1 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::innerSize
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->demoTrajs_);
  this->numDemos_ = (int)IVar1;
  IVar1 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::outerSize
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->demoTrajs_);
  this->trajLength_ = (int)IVar1;
  this->dt_ = 1.0 / (double)this->trajLength_;
  linspace((ProMP *)local_48,0.0,1.0,(int)this);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            (&this->numBfMid_,(Matrix<double,__1,_1,_0,__1,_1> *)local_48);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_48);
  computePhase(this,1.0);
  generateBasisFunction(&local_60,this,&this->phase_,this->trajLength_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->phi_,&local_60);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_60);
  train(this,pMStack_18);
  return;
}

Assistant:

ProMP::ProMP(Eigen::MatrixXd& data,int numBf, double stdBf):demoTrajs_(data),numBf_(numBf),stdBf_(stdBf){
	numDemos_ = demoTrajs_.innerSize();
	trajLength_ = demoTrajs_.outerSize();
	dt_ = 1.0/trajLength_;
	numBfMid_ = linspace(0,1,numBf_);
	computePhase(1.0);
	phi_ = generateBasisFunction(phase_,trajLength_);
	train(data);
	}